

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int bam_readrec(BGZF *fp,void *ignored,void *bv,int *tid,int *beg,int *end)

{
  int iVar1;
  int iVar2;
  undefined4 local_4c;
  int ret;
  bam1_t *b;
  int *end_local;
  int *beg_local;
  int *tid_local;
  void *bv_local;
  void *ignored_local;
  BGZF *fp_local;
  
  iVar2 = bam_read1(fp,(bam1_t *)bv);
  if (-1 < iVar2) {
    *tid = *bv;
    *beg = *(int *)((long)bv + 4);
    iVar1 = *(int *)((long)bv + 4);
    if ((short)((ulong)*(undefined8 *)((long)bv + 8) >> 0x30) == 0) {
      local_4c = 1;
    }
    else {
      local_4c = bam_cigar2rlen((uint)(ushort)((ulong)*(undefined8 *)((long)bv + 8) >> 0x30),
                                (uint32_t *)
                                (*(long *)((long)bv + 0x28) +
                                (long)(int)((uint)((ulong)*(undefined8 *)((long)bv + 8) >> 0x18) &
                                           0xff)));
    }
    *end = iVar1 + local_4c;
  }
  return iVar2;
}

Assistant:

static int bam_readrec(BGZF *fp, void *ignored, void *bv, int *tid, int *beg, int *end)
{
    bam1_t *b = bv;
    int ret;
    if ((ret = bam_read1(fp, b)) >= 0) {
        *tid = b->core.tid; *beg = b->core.pos;
        *end = b->core.pos + (b->core.n_cigar? bam_cigar2rlen(b->core.n_cigar, bam_get_cigar(b)) : 1);
    }
    return ret;
}